

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
::IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_> *this)

{
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false> _Var2;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  _Var3;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false> _Var4;
  bool bVar5;
  char cVar6;
  int iVar7;
  unique_ptr<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  uVar8;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  _Var9;
  
  bVar5 = AtEnd(this);
  if (bVar5) {
    __assert_fail("!AtEnd()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                  ,0x361,
                  "virtual void testing::internal::CartesianProductGenerator<unsigned short, unsigned int, bssl::(anonymous namespace)::ssl_test_ticket_aead_failure_mode>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1, 2>>::Advance() [T = <unsigned short, unsigned int, bssl::(anonymous namespace)::ssl_test_ticket_aead_failure_mode>, I = std::integer_sequence<unsigned long, 0, 1, 2>]"
                 );
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                        .
                        super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
                        ._M_head_impl.impl_._M_t + 0x18))();
  uVar8._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
       .
       super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
       ._M_head_impl.impl_._M_t;
  if ((_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       )uVar8._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
        ._M_head_impl !=
      (ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode> *)
      *(tuple<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        *)&(this->end_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
           .
           super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
           .
           super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
           .
           super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
           ._M_head_impl.impl_._M_t) {
    cVar6 = (**(code **)(*(long *)uVar8._M_t.
                                  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
                                  .
                                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
                                  ._M_head_impl + 0x30))();
    if (cVar6 == '\0') goto LAB_001a6bcc;
  }
  uVar8._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>,_true,_true>
        )(**(code **)(*(long *)(this->begin_).
                               super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                               .
                               super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                               .
                               super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                               .
                               super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
                               ._M_head_impl.impl_._M_t + 0x20))();
  _Var1._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
  ._M_head_impl =
       *(tuple<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
         *)&(this->current_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
            .
            super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
            .
            super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
            .
            super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
            ._M_head_impl.impl_._M_t;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  .
  super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
  ._M_head_impl.impl_._M_t =
       uVar8._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
       ._M_head_impl;
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                        .
                        super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
              + 0x18))();
  _Var2._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
       .super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.
       impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
       .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl !=
      ((ParamIteratorInterface<unsigned_int> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
      .
      super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
      .super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.
      impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>).
      _M_head_impl) {
    iVar7 = (*(_Var2._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar7 == '\0') goto LAB_001a6bcc;
  }
  _Var9.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>)
                 (**(code **)(*(long *)(this->begin_).
                                       super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                       .
                                       super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                       .
                                       super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>
                                       ._M_head_impl.impl_._M_t.
                                       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                                       .
                                       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                             + 0x20))();
  _Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                 .super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                 _M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
  ;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>._M_head_impl.impl_.
  _M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false> =
       _Var9.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
       ._M_head_impl;
  if (_Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<unsigned_int> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_short>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
              + 0x18))();
  _Var4._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
       .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_short>,_false>._M_head_impl.
       impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
       .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>.
       _M_head_impl;
  if (_Var4._M_head_impl !=
      ((ParamIteratorInterface<unsigned_short> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
      .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_short>,_false>._M_head_impl.
      impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>).
      _M_head_impl) {
    (*(_Var4._M_head_impl)->_vptr_ParamIteratorInterface[6])();
  }
LAB_001a6bcc:
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }